

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

double activityContributionMin(double coef,double *lb,double *ub)

{
  double dVar1;
  
  if (0.0 <= coef) {
    dVar1 = -INFINITY;
    if (-INFINITY < *lb) {
      dVar1 = *lb * coef;
    }
  }
  else if (*ub < INFINITY) {
    dVar1 = *ub * coef;
  }
  else {
    dVar1 = -INFINITY;
  }
  return dVar1;
}

Assistant:

static double activityContributionMin(double coef, const double& lb,
                                      const double& ub) {
  if (coef < 0) {
    if (ub == kHighsInf) return -kHighsInf;

    return coef * ub;
  } else {
    if (lb == -kHighsInf) return -kHighsInf;

    return coef * lb;
  }
}